

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::NetParameter::Clear(NetParameter *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  NetState *this_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase);
  (this->input_dim_).current_size_ = 0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(this->input_shape_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
            (&(this->layer_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x176d);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,
                            "CHECK failed: !name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        psVar3 = (this->name_).ptr_;
      }
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      this_00 = this->state_;
      if (this_00 == (NetState *)0x0) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_48,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x1771);
        pLVar2 = google::protobuf::internal::LogMessage::operator<<
                           (&local_48,"CHECK failed: state_ != NULL: ");
        google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar2);
        google::protobuf::internal::LogMessage::~LogMessage(&local_48);
        this_00 = this->state_;
      }
      NetState::Clear(this_00);
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
  }
  if ((uVar1 & 0xc) != 0) {
    this->force_backward_ = false;
    this->debug_info_ = false;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void NetParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.NetParameter)
  layers_.Clear();
  input_.Clear();
  input_dim_.Clear();
  input_shape_.Clear();
  layer_.Clear();
  if (_has_bits_[0 / 32] & 3u) {
    if (has_name()) {
      GOOGLE_DCHECK(!name_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*name_.UnsafeRawStringPointer())->clear();
    }
    if (has_state()) {
      GOOGLE_DCHECK(state_ != NULL);
      state_->::caffe::NetState::Clear();
    }
  }
  if (_has_bits_[0 / 32] & 12u) {
    ::memset(&force_backward_, 0, reinterpret_cast<char*>(&debug_info_) -
      reinterpret_cast<char*>(&force_backward_) + sizeof(debug_info_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}